

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::generateIterations
          (TextureGather2DArrayCase *this)

{
  TextureFormat *textureFormat;
  undefined8 *puVar1;
  int *piVar2;
  GatherType gatherType;
  ChannelOrder CVar3;
  pointer pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined1 local_78 [48];
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  textureFormat = &(this->super_TextureGatherCase).m_textureFormat;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_78);
  generateBasic2DCaseIterations(&basicIterations,gatherType,textureFormat,(IVec2 *)local_78);
  uVar10 = ((long)basicIterations.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)basicIterations.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  uVar11 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    uVar11 = 0;
  }
  iVar12 = -1;
  do {
    if ((this->m_textureSize).m_data[2] + 1 <= iVar12) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::~vector(&basicIterations);
      return;
    }
    if (iVar12 == 0) {
      for (lVar13 = 0; uVar11 * 0x24 - lVar13 != 0; lVar13 = lVar13 + 0x24) {
        local_78._16_8_ = (pointer)0x0;
        local_78._24_8_ = 0;
        local_78._0_8_ = (_func_int **)0x0;
        local_78._8_8_ = (TestContext *)0x0;
        local_78._32_8_ = 0;
        GatherArgs::GatherArgs((GatherArgs *)local_78);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
        ::push_back(&this->m_iterations,(value_type *)local_78);
        pIVar4 = (this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar4[-1].gatherArgs.offsets[3].m_data[1] =
             *(int *)((long)(basicIterations.
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                             ._M_impl.super__Vector_impl_data._M_start)->offsets[3].m_data +
                     lVar13 + 4);
        piVar2 = (int *)((long)(basicIterations.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                        lVar13 + -4);
        iVar5 = *piVar2;
        iVar6 = piVar2[1];
        iVar7 = piVar2[2];
        iVar8 = piVar2[3];
        puVar1 = (undefined8 *)
                 ((long)(basicIterations.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                         ._M_impl.super__Vector_impl_data._M_start)->offsets[1].m_data + lVar13 + 4)
        ;
        uVar9 = puVar1[1];
        *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[1].m_data + 1) = *puVar1;
        *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[2].m_data + 1) = uVar9;
        pIVar4[-1].gatherArgs.componentNdx = iVar5;
        pIVar4[-1].gatherArgs.offsets[0].m_data[0] = iVar6;
        pIVar4[-1].gatherArgs.offsets[0].m_data[1] = iVar7;
        pIVar4[-1].gatherArgs.offsets[1].m_data[0] = iVar8;
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].layerNdx = 0;
      }
    }
    else {
      CVar3 = textureFormat->order;
      for (lVar13 = 0; uVar11 * 0x24 - lVar13 != 0; lVar13 = lVar13 + 0x24) {
        if (((CVar3 == D) || (CVar3 == DS)) ||
           (*(int *)((long)(basicIterations.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                            ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                    lVar13 + -4) == (iVar12 + 2) % 4)) {
          local_78._16_8_ = (pointer)0x0;
          local_78._24_8_ = 0;
          local_78._0_8_ = (_func_int **)0x0;
          local_78._8_8_ = (TestContext *)0x0;
          local_78._32_8_ = 0;
          GatherArgs::GatherArgs((GatherArgs *)local_78);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
          ::push_back(&this->m_iterations,(value_type *)local_78);
          pIVar4 = (this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pIVar4[-1].gatherArgs.offsets[3].m_data[1] =
               *(int *)((long)(basicIterations.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                               ._M_impl.super__Vector_impl_data._M_start)->offsets[3].m_data +
                       lVar13 + 4);
          piVar2 = (int *)((long)(basicIterations.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                          lVar13 + -4);
          iVar5 = *piVar2;
          iVar6 = piVar2[1];
          iVar7 = piVar2[2];
          iVar8 = piVar2[3];
          puVar1 = (undefined8 *)
                   ((long)(basicIterations.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                           ._M_impl.super__Vector_impl_data._M_start)->offsets[1].m_data +
                   lVar13 + 4);
          uVar9 = puVar1[1];
          *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[1].m_data + 1) = *puVar1;
          *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[2].m_data + 1) = uVar9;
          pIVar4[-1].gatherArgs.componentNdx = iVar5;
          pIVar4[-1].gatherArgs.offsets[0].m_data[0] = iVar6;
          pIVar4[-1].gatherArgs.offsets[0].m_data[1] = iVar7;
          pIVar4[-1].gatherArgs.offsets[1].m_data[0] = iVar8;
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].layerNdx = iVar12;
          break;
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void TextureGather2DArrayCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	// \note Out-of-bounds layer indices are tested too.
	for (int layerNdx = -1; layerNdx < m_textureSize.z()+1; layerNdx++)
	{
		// Don't duplicate all cases for all layers.
		if (layerNdx == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().layerNdx = layerNdx;
			}
		}
		else
		{
			// For other layers than 0, only test one component and one set of offsets per layer.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == (layerNdx + 2) % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().layerNdx = layerNdx;
					break;
				}
			}
		}
	}
}